

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyStateTransitionDesc
               (IRenderDevice *pDevice,StateTransitionDesc *Barrier,
               DeviceContextIndex ExecutionCtxId,DeviceContextDesc *CtxDesc)

{
  Uint32 *Args_1;
  Uint32 *Args_1_00;
  byte bVar1;
  RESOURCE_STATE RVar2;
  bool bVar3;
  RESOURCE_DIMENSION RVar4;
  RESOURCE_DIMENSION RVar5;
  STATE_TRANSITION_TYPE SVar6;
  int iVar7;
  RESOURCE_STATE RVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*Args_1_01) [41];
  char (*pacVar10) [39];
  undefined4 extraout_var_01;
  Uint32 UVar11;
  DeviceContextDesc *Args_1_02;
  undefined7 uVar13;
  char (*Args_1_03) [132];
  char (*pacVar12) [43];
  char (*Args_1_04) [75];
  IObject *pObj;
  char *pcVar14;
  RefCntAutoPtr<Diligent::IBuffer> *in_R9;
  uint uVar15;
  undefined1 auVar16 [16];
  char (*Args_7) [15];
  char (*in_stack_ffffffffffffff58) [3];
  string msg;
  RefCntAutoPtr<Diligent::IBuffer> pBuffer;
  char (*local_70) [43];
  Uint64 ImmediateContextMask;
  RefCntAutoPtr<Diligent::IBottomLevelAS> pBottomLevelAS;
  RefCntAutoPtr<Diligent::ITopLevelAS> pTopLevelAS;
  RefCntAutoPtr<Diligent::ITexture> pTexture;
  RefCntAutoPtr<Diligent::IBuffer> *Args_3;
  
  if ((Barrier->Flags & STATE_TRANSITION_FLAG_ALIASING) != STATE_TRANSITION_FLAG_NONE) {
    pcVar14 = (char *)Barrier;
    if ((Barrier->Flags & ~STATE_TRANSITION_FLAG_ALIASING) != STATE_TRANSITION_FLAG_NONE) {
      FormatString<char[42],char[71]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags",
                 (char (*) [71])CtxDesc);
      pcVar14 = "VerifyStateTransitionDesc";
      CtxDesc = (DeviceContextDesc *)0x1e4;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1e4);
      std::__cxx11::string::~string((string *)&msg);
      if ((Barrier->Flags & STATE_TRANSITION_FLAG_ALIASING) == STATE_TRANSITION_FLAG_NONE) {
        FormatString<char[26],char[47]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING",
                   (char (*) [47])CtxDesc);
        pcVar14 = "VerifyAliasingBarrierDesc";
        CtxDesc = (DeviceContextDesc *)0x1a6;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x1a6);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    RVar4 = VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)Barrier->pResourceBefore,(IDeviceObject *)pcVar14)
    ;
    RVar5 = VerifyAliasingBarrierDesc::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)Barrier->pResource,(IDeviceObject *)pcVar14);
    uVar13 = (undefined7)((ulong)CtxDesc >> 8);
    Args_1_03 = (char (*) [132])CONCAT71(uVar13,RVar4 == RESOURCE_DIM_UNDEFINED);
    if ((RVar5 != RESOURCE_DIM_UNDEFINED && RVar4 != RESOURCE_DIM_UNDEFINED) &&
       (Args_1_03 = (char (*) [132])CONCAT71(uVar13,RVar4 == RESOURCE_DIM_BUFFER),
       (RVar5 != RESOURCE_DIM_BUFFER) == (RVar4 == RESOURCE_DIM_BUFFER))) {
      FormatString<char[42],char[130]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "Both before- and after-resources must either be buffers or textures. Sparse aliasing between textures and buffers is not allowed."
                 ,(char (*) [130])Args_1_03);
      Args_1_03 = (char (*) [132])0x1cf;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1cf);
      std::__cxx11::string::~string((string *)&msg);
    }
    RVar8 = Barrier->NewState | Barrier->OldState;
    if (RVar8 != RESOURCE_STATE_UNKNOWN) {
      FormatString<char[42],char[111]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])
                 "Aliasing barrier does not support state transitions. OldState and NewState must both be RESOURCE_STATE_UNKNOWN"
                 ,(char (*) [111])Args_1_03);
      Args_1_03 = (char (*) [132])0x1d3;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1d3);
      RVar8 = std::__cxx11::string::~string((string *)&msg);
    }
    auVar16._0_4_ = -(uint)(Barrier->FirstMipLevel == 0);
    auVar16._4_4_ = -(uint)(Barrier->MipLevelsCount == 0xffffffff);
    auVar16._8_4_ = -(uint)(Barrier->FirstArraySlice == 0);
    auVar16._12_4_ = -(uint)(Barrier->ArraySliceCount == 0xffffffff);
    iVar7 = movmskps(RVar8,auVar16);
    if (iVar7 == 0xf) {
      return true;
    }
    FormatString<char[42],char[132]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "Aliasing barrier is applied to all subresources. FirstMipLevel, MipLevelsCount, FirstArraySlice and ArraySliceCount must be default"
               ,Args_1_03);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyAliasingBarrierDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1d7);
    std::__cxx11::string::~string((string *)&msg);
    return true;
  }
  Args_1_02 = CtxDesc;
  if (Barrier->pResourceBefore != (IDeviceObject *)0x0) {
    FormatString<char[42],char[77]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "pResourceBefore is only used for aliasing barrier and must be null otherwise",
               (char (*) [77])CtxDesc);
    Args_1_02 = (DeviceContextDesc *)0x1e8;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1e8);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (Barrier->NewState < RESOURCE_STATE_VERTEX_BUFFER) {
    FormatString<char[42],char[42]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"NewState must not be UNKNOWN or UNDEFINED",(char (*) [42])Args_1_02);
    Args_1_02 = (DeviceContextDesc *)0x1ea;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1ea);
    std::__cxx11::string::~string((string *)&msg);
  }
  pObj = &Barrier->pResource->super_IObject;
  if (pObj == (IObject *)0x0) {
    FormatString<char[42],char[28]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"pResource must not be null.",(char (*) [28])Args_1_02);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x1ed);
    std::__cxx11::string::~string((string *)&msg);
    pObj = &Barrier->pResource->super_IObject;
  }
  ImmediateContextMask = 0;
  RefCntAutoPtr<Diligent::ITexture>::RefCntAutoPtr(&pTexture,pObj,(INTERFACE_ID *)IID_Texture);
  if (pTexture.m_pObject == (ITexture *)0x0) {
    RefCntAutoPtr<Diligent::IBuffer>::RefCntAutoPtr
              (&pBuffer,&Barrier->pResource->super_IObject,(INTERFACE_ID *)IID_Buffer);
    if ((long *)CONCAT44(pBuffer.m_pObject._4_4_,(int)pBuffer.m_pObject) == (long *)0x0) {
      RefCntAutoPtr<Diligent::IBottomLevelAS>::RefCntAutoPtr
                (&pBottomLevelAS,&Barrier->pResource->super_IObject,
                 (INTERFACE_ID *)IID_BottomLevelAS);
      if ((long *)CONCAT44(pBottomLevelAS.m_pObject._4_4_,pBottomLevelAS.m_pObject._0_4_) ==
          (long *)0x0) {
        RefCntAutoPtr<Diligent::ITopLevelAS>::RefCntAutoPtr
                  (&pTopLevelAS,&Barrier->pResource->super_IObject,(INTERFACE_ID *)IID_TopLevelAS);
        if (pTopLevelAS.m_pObject == (ITopLevelAS *)0x0) {
          FormatString<char[26]>(&msg,(char (*) [26])"unsupported resource type");
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x236);
          std::__cxx11::string::~string((string *)&msg);
          local_70 = (char (*) [43])0x0;
          RVar8 = RESOURCE_STATE_UNKNOWN;
        }
        else {
          iVar7 = (*((pTopLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])()
          ;
          pacVar10 = (char (*) [39])CONCAT44(extraout_var_01,iVar7);
          local_70 = *(char (**) [43])(*pacVar10 + 0x18);
          RVar8 = Barrier->OldState;
          pacVar12 = local_70;
          ImmediateContextMask = (Uint64)local_70;
          if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
             (RVar8 = (*((pTopLevelAS.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject
                        [0xd])(), RVar8 == RESOURCE_STATE_UNKNOWN)) {
            FormatString<char[42],char[20],char_const*,char[75]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])0x5b2385,(char (*) [20])pacVar10,
                       (char **)
                       "\' is unknown to the engine and is not explicitly specified in the barrier."
                       ,(char (*) [75])in_R9);
            pacVar12 = (char (*) [43])0x22f;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x22f);
            std::__cxx11::string::~string((string *)&msg);
            RVar8 = RESOURCE_STATE_UNKNOWN;
          }
          RVar2 = Barrier->NewState;
          if (((RVar2 != RESOURCE_STATE_BUILD_AS_READ) && (RVar2 != RESOURCE_STATE_BUILD_AS_WRITE))
             && (RVar2 != RESOURCE_STATE_RAY_TRACING)) {
            FormatString<char[42],char[39],char_const*,char[3]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"invalid new state specified for TLAS \'",pacVar10,
                       (char **)"\'.",(char (*) [3])in_R9);
            pacVar12 = (char (*) [43])0x231;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x231);
            std::__cxx11::string::~string((string *)&msg);
          }
          if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
            FormatString<char[42],char[43]>
                      (&msg,(Diligent *)"State transition parameters are invalid: ",
                       (char (*) [42])"split barriers are not supported for TLAS.",pacVar12);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x232);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
        RefCntAutoPtr<Diligent::ITopLevelAS>::Release(&pTopLevelAS);
      }
      else {
        pacVar10 = (char (*) [39])
                   (**(code **)(*(long *)CONCAT44(pBottomLevelAS.m_pObject._4_4_,
                                                  pBottomLevelAS.m_pObject._0_4_) + 0x20))();
        local_70 = *(char (**) [43])(pacVar10[1] + 9);
        RVar8 = Barrier->OldState;
        pacVar12 = local_70;
        ImmediateContextMask = (Uint64)local_70;
        if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
           (RVar8 = (**(code **)(*(long *)CONCAT44(pBottomLevelAS.m_pObject._4_4_,
                                                   pBottomLevelAS.m_pObject._0_4_) + 0x70))(),
           RVar8 == RESOURCE_STATE_UNKNOWN)) {
          FormatString<char[42],char[20],char_const*,char[75]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])0x5b2304,(char (*) [20])pacVar10,
                     (char **)
                     "\' is unknown to the engine and is not explicitly specified in the barrier.",
                     (char (*) [75])in_R9);
          pacVar12 = (char (*) [43])0x225;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x225);
          std::__cxx11::string::~string((string *)&msg);
          RVar8 = RESOURCE_STATE_UNKNOWN;
        }
        if ((Barrier->NewState != RESOURCE_STATE_BUILD_AS_READ) &&
           (Barrier->NewState != RESOURCE_STATE_BUILD_AS_WRITE)) {
          FormatString<char[42],char[39],char_const*,char[3]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"invalid new state specified for BLAS \'",pacVar10,
                     (char **)"\'.",(char (*) [3])in_R9);
          pacVar12 = (char (*) [43])0x227;
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x227);
          std::__cxx11::string::~string((string *)&msg);
        }
        if (Barrier->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) {
          FormatString<char[42],char[43]>
                    (&msg,(Diligent *)"State transition parameters are invalid: ",
                     (char (*) [42])"split barriers are not supported for BLAS.",pacVar12);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                     ,0x228);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
      RefCntAutoPtr<Diligent::IBottomLevelAS>::Release(&pBottomLevelAS);
    }
    else {
      Args_1_01 = (char (*) [41])
                  (**(code **)(*(long *)CONCAT44(pBuffer.m_pObject._4_4_,(int)pBuffer.m_pObject) +
                              0x20))();
      local_70 = *(char (**) [43])(*Args_1_01 + 0x20);
      ImmediateContextMask = (Uint64)local_70;
      bVar3 = VerifyResourceStates(Barrier->NewState,false);
      if (!bVar3) {
        FormatString<char[42],char[41],char_const*,char[3]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid new state specified for buffer \'",Args_1_01,
                   (char **)"\'.",(char (*) [3])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21b);
        std::__cxx11::string::~string((string *)&msg);
      }
      RVar8 = Barrier->OldState;
      if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
         (RVar8 = (**(code **)(*(long *)CONCAT44(pBuffer.m_pObject._4_4_,(int)pBuffer.m_pObject) +
                              0x60))(), RVar8 == RESOURCE_STATE_UNKNOWN)) {
        FormatString<char[42],char[22],char_const*,char[75]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])0x5b2232,(char (*) [22])Args_1_01,
                   (char **)
                   "\' is unknown to the engine and is not explicitly specified in the barrier.",
                   (char (*) [75])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21d);
        std::__cxx11::string::~string((string *)&msg);
        RVar8 = RESOURCE_STATE_UNKNOWN;
      }
      bVar3 = VerifyResourceStates(RVar8,false);
      if (!bVar3) {
        FormatString<char[42],char[41],char_const*,char[3]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"invalid old state specified for buffer \'",Args_1_01,
                   (char **)"\'.",(char (*) [3])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x21e);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    RefCntAutoPtr<Diligent::IBuffer>::Release(&pBuffer);
  }
  else {
    iVar7 = (*((pTexture.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    Args_3 = (RefCntAutoPtr<Diligent::IBuffer> *)CONCAT44(extraout_var,iVar7);
    local_70 = *(char (**) [43])(Args_3 + 9);
    ImmediateContextMask = (Uint64)local_70;
    bVar3 = VerifyResourceStates(Barrier->NewState,true);
    if (!bVar3) {
      FormatString<char[42],char[42],char_const*,char[3]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"invalid new state specified for texture \'",(char (*) [42])Args_3,
                 (char **)"\'.",(char (*) [3])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1f7);
      std::__cxx11::string::~string((string *)&msg);
    }
    RVar8 = Barrier->OldState;
    if ((RVar8 == RESOURCE_STATE_UNKNOWN) &&
       (RVar8 = (*((pTexture.m_pObject)->super_IDeviceObject).super_IObject._vptr_IObject[0xc])(),
       RVar8 == RESOURCE_STATE_UNKNOWN)) {
      FormatString<char[42],char[23],char_const*,char[75]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])0x5b20d9,(char (*) [23])Args_3,
                 (char **)
                 "\' is unknown to the engine and is not explicitly specified in the barrier.",
                 (char (*) [75])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1fb);
      std::__cxx11::string::~string((string *)&msg);
      RVar8 = RESOURCE_STATE_UNKNOWN;
    }
    uVar15 = 1;
    Args_7 = (char (*) [15])0x3e8654;
    bVar3 = VerifyResourceStates(RVar8,true);
    if (!bVar3) {
      FormatString<char[42],char[42],char_const*,char[3]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"invalid old state specified for texture \'",(char (*) [42])Args_3,
                 (char **)"\'.",(char (*) [3])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x1fc);
      Args_7 = (char (*) [15])0x3e86a1;
      std::__cxx11::string::~string((string *)&msg);
    }
    Args_1 = &Barrier->FirstMipLevel;
    pcVar14 = (char *)((long)(Args_3 + 3) + 4);
    if (*(uint *)((long)(Args_3 + 3) + 4) <= Barrier->FirstMipLevel) {
      in_R9 = Args_3;
      FormatString<char[42],char[18],unsigned_int,char[54],char_const*,char[12],unsigned_int,char[15]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"first mip level (",(char (*) [18])Args_1,
                 (uint *)") specified by the barrier is out of range. Texture \'",
                 (char (*) [54])Args_3,(char **)"\' has only ",(char (*) [12])pcVar14,
                 (uint *)" mip level(s).",Args_7);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x200);
      Args_7 = (char (*) [15])0x3e8718;
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((Barrier->MipLevelsCount != 0xffffffff) &&
       (uVar9 = Barrier->MipLevelsCount + *Args_1, *(uint *)pcVar14 < uVar9)) {
      pBuffer.m_pObject._0_4_ = uVar9 - 1;
      in_R9 = &pBuffer;
      FormatString<char[42],char[17],unsigned_int,char[3],unsigned_int,char[53],char_const*,char[12],unsigned_int,char[15]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"mip level range ",(char (*) [17])Args_1,(uint *)"..",
                 (char (*) [3])in_R9,(uint *)0x65e404,(char (*) [53])Args_3,(char **)"\' has only ",
                 (char (*) [12])pcVar14,(uint *)" mip level(s).",Args_7);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x204);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar1 = *(byte *)(Args_3 + 1);
    if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
      uVar15 = *(uint *)((long)(Args_3 + 2) + 4);
    }
    Args_1_00 = &Barrier->FirstArraySlice;
    if (uVar15 <= Barrier->FirstArraySlice) {
      pBuffer.m_pObject._0_4_ = 1;
      if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
        pBuffer.m_pObject._0_4_ = *(int *)((long)(Args_3 + 2) + 4);
      }
      in_R9 = Args_3;
      FormatString<char[42],char[20],unsigned_int,char[68],char_const*,char[6],unsigned_int>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"first array slice (",(char (*) [20])Args_1_00,
                 (uint *)") specified by the barrier is out of range. Array size of texture \'",
                 (char (*) [68])Args_3,(char **)"\' is ",(char (*) [6])&pBuffer,
                 (uint *)in_stack_ffffffffffffff58);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x208);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (Barrier->ArraySliceCount != 0xffffffff) {
      bVar1 = *(byte *)(Args_3 + 1);
      uVar15 = 1;
      if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
        uVar15 = *(uint *)((long)(Args_3 + 2) + 4);
      }
      uVar9 = *Args_1_00 + Barrier->ArraySliceCount;
      if (uVar15 < uVar9) {
        pBuffer.m_pObject._0_4_ = uVar9 - 1;
        pBottomLevelAS.m_pObject._0_4_ = 1;
        if ((bVar1 < 9) && ((0x1a8U >> (bVar1 & 0x1f) & 1) != 0)) {
          pBottomLevelAS.m_pObject._0_4_ = *(undefined4 *)((long)(Args_3 + 2) + 4);
        }
        in_R9 = &pBuffer;
        FormatString<char[42],char[19],unsigned_int,char[3],unsigned_int,char[67],char_const*,char[6],unsigned_int>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"array slice range ",(char (*) [19])Args_1_00,(uint *)"..",
                   (char (*) [3])in_R9,(uint *)0x65e47d,(char (*) [67])Args_3,(char **)"\' is ",
                   (char (*) [6])&pBottomLevelAS,(uint *)in_stack_ffffffffffffff58);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x20c);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])();
    if ((*(int *)CONCAT44(extraout_var_00,iVar7) != 2) &&
       (*(int *)CONCAT44(extraout_var_00,iVar7) != 5)) {
      if ((*Args_1 != 0) ||
         ((Barrier->MipLevelsCount != 0xffffffff && (Barrier->MipLevelsCount != *(Uint32 *)pcVar14))
         )) {
        FormatString<char[42],char[31],char_const*,char[60]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"failed to transition texture \'",(char (*) [31])Args_3,
                   (char **)"\': only whole resources can be transitioned on this device.",
                   (char (*) [60])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x212);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (*Args_1_00 == 0) {
        if (Barrier->ArraySliceCount != 0xffffffff) {
          UVar11 = 1;
          if ((*(byte *)(Args_3 + 1) < 9) && ((0x1a8U >> (*(byte *)(Args_3 + 1) & 0x1f) & 1) != 0))
          {
            UVar11 = *(Uint32 *)((long)(Args_3 + 2) + 4);
          }
          if (Barrier->ArraySliceCount != UVar11) goto LAB_003e8c9e;
        }
      }
      else {
LAB_003e8c9e:
        FormatString<char[42],char[31],char_const*,char[60]>
                  (&msg,(Diligent *)"State transition parameters are invalid: ",
                   (char (*) [42])"failed to transition texture \'",(char (*) [31])Args_3,
                   (char **)"\': only whole resources can be transitioned on this device.",
                   (char (*) [60])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x214);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
  RefCntAutoPtr<Diligent::ITexture>::Release(&pTexture);
  if (((ulong)local_70 >> ((ulong)ExecutionCtxId.m_Value & 0x3f) & 1) == 0) {
    FormatString<char[42],char[50],std::ios_base&(std::ios_base&),unsigned_long,char[41],char_const*,char[3]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])"resource was created with ImmediateContextMask 0x",
               (char (*) [50])std::hex,(_func_ios_base_ptr_ios_base_ptr *)&ImmediateContextMask,
               (unsigned_long *)" and can not be used in device context \'",(char (*) [41])CtxDesc,
               (char **)"\'.",in_stack_ffffffffffffff58);
    local_70 = (char (*) [43])0x23a;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x23a);
    std::__cxx11::string::~string((string *)&msg);
  }
  bVar3 = Barrier->NewState != RESOURCE_STATE_UNORDERED_ACCESS;
  Args_1_04 = (char (*) [75])
              CONCAT71((int7)((ulong)local_70 >> 8),
                       bVar3 || RVar8 != RESOURCE_STATE_UNORDERED_ACCESS);
  SVar6 = Barrier->TransitionType;
  if (SVar6 != STATE_TRANSITION_TYPE_IMMEDIATE &&
      (!bVar3 && RVar8 == RESOURCE_STATE_UNORDERED_ACCESS)) {
    FormatString<char[42],char[75]>
              (&msg,(Diligent *)"State transition parameters are invalid: ",
               (char (*) [42])
               "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.",
               Args_1_04);
    Args_1_04 = (char (*) [75])0x23f;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x23f);
    std::__cxx11::string::~string((string *)&msg);
    SVar6 = Barrier->TransitionType;
  }
  if ((SVar6 != STATE_TRANSITION_TYPE_IMMEDIATE) && (SVar6 != STATE_TRANSITION_TYPE_END)) {
    if (SVar6 == STATE_TRANSITION_TYPE_BEGIN) {
      if ((Barrier->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == STATE_TRANSITION_FLAG_NONE)
      goto LAB_003e917f;
      FormatString<char[42],char[56]>
                (&msg,(Diligent *)"State transition parameters are invalid: ",
                 (char (*) [42])"resource state can\'t be updated in begin-split barrier.",
                 (char (*) [56])Args_1_04);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x248);
    }
    else {
      FormatString<char[27]>(&msg,(char (*) [27])"Unexpected transition type");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyStateTransitionDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x24f);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
LAB_003e917f:
  VerifyResourceState(Barrier->OldState,CtxDesc->QueueType,"OldState");
  VerifyResourceState(Barrier->NewState,CtxDesc->QueueType,"NewState");
  return true;
}

Assistant:

bool VerifyStateTransitionDesc(const IRenderDevice*       pDevice,
                               const StateTransitionDesc& Barrier,
                               DeviceContextIndex         ExecutionCtxId,
                               const DeviceContextDesc&   CtxDesc)
{
    if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
    {
        CHECK_STATE_TRANSITION_DESC((Barrier.Flags & ~STATE_TRANSITION_FLAG_ALIASING) == 0,
                                    "STATE_TRANSITION_FLAG_ALIASING flag is not compatible with other flags");
        return VerifyAliasingBarrierDesc(Barrier);
    }

    CHECK_STATE_TRANSITION_DESC(Barrier.pResourceBefore == nullptr, "pResourceBefore is only used for aliasing barrier and must be null otherwise");
    CHECK_STATE_TRANSITION_DESC(Barrier.NewState != RESOURCE_STATE_UNKNOWN && Barrier.NewState != RESOURCE_STATE_UNDEFINED,
                                "NewState must not be UNKNOWN or UNDEFINED");


    CHECK_STATE_TRANSITION_DESC(Barrier.pResource != nullptr, "pResource must not be null.");

    RESOURCE_STATE OldState             = RESOURCE_STATE_UNKNOWN;
    Uint64         ImmediateContextMask = 0;

    if (RefCntAutoPtr<ITexture> pTexture{Barrier.pResource, IID_Texture})
    {
        const TextureDesc& TexDesc = pTexture->GetDesc();
        ImmediateContextMask       = TexDesc.ImmediateContextMask;

        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, true), "invalid new state specified for texture '", TexDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTexture->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN,
                                    "the state of texture '", TexDesc.Name,
                                    "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, true), "invalid old state specified for texture '", TexDesc.Name, "'.");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel < TexDesc.MipLevels, "first mip level (", Barrier.FirstMipLevel,
                                    ") specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");
        CHECK_STATE_TRANSITION_DESC(Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.FirstMipLevel + Barrier.MipLevelsCount <= TexDesc.MipLevels,
                                    "mip level range ", Barrier.FirstMipLevel, "..", Barrier.FirstMipLevel + Barrier.MipLevelsCount - 1,
                                    " specified by the barrier is out of range. Texture '",
                                    TexDesc.Name, "' has only ", TexDesc.MipLevels, " mip level(s).");

        CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice < TexDesc.GetArraySize(), "first array slice (", Barrier.FirstArraySlice,
                                    ") specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());
        CHECK_STATE_TRANSITION_DESC(Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.FirstArraySlice + Barrier.ArraySliceCount <= TexDesc.GetArraySize(),
                                    "array slice range ", Barrier.FirstArraySlice, "..", Barrier.FirstArraySlice + Barrier.ArraySliceCount - 1,
                                    " specified by the barrier is out of range. Array size of texture '",
                                    TexDesc.Name, "' is ", TexDesc.GetArraySize());

        RENDER_DEVICE_TYPE DeviceType = pDevice->GetDeviceInfo().Type;
        if (DeviceType != RENDER_DEVICE_TYPE_D3D12 && DeviceType != RENDER_DEVICE_TYPE_VULKAN)
        {
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstMipLevel == 0 && (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS || Barrier.MipLevelsCount == TexDesc.MipLevels),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
            CHECK_STATE_TRANSITION_DESC(Barrier.FirstArraySlice == 0 && (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES || Barrier.ArraySliceCount == TexDesc.GetArraySize()),
                                        "failed to transition texture '", TexDesc.Name, "': only whole resources can be transitioned on this device.");
        }
    }
    else if (RefCntAutoPtr<IBuffer> pBuffer{Barrier.pResource, IID_Buffer})
    {
        const BufferDesc& BuffDesc = pBuffer->GetDesc();
        ImmediateContextMask       = BuffDesc.ImmediateContextMask;
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(Barrier.NewState, false), "invalid new state specified for buffer '", BuffDesc.Name, "'.");
        OldState = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBuffer->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of buffer '", BuffDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(VerifyResourceStates(OldState, false), "invalid old state specified for buffer '", BuffDesc.Name, "'.");
    }
    else if (RefCntAutoPtr<IBottomLevelAS> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
    {
        const BottomLevelASDesc& BLASDesc = pBottomLevelAS->GetDesc();
        ImmediateContextMask              = BLASDesc.ImmediateContextMask;
        OldState                          = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pBottomLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of BLAS '", BLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE,
                                    "invalid new state specified for BLAS '", BLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for BLAS.");
    }
    else if (RefCntAutoPtr<ITopLevelAS> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
    {
        const TopLevelASDesc& TLASDesc = pTopLevelAS->GetDesc();
        ImmediateContextMask           = TLASDesc.ImmediateContextMask;
        OldState                       = Barrier.OldState != RESOURCE_STATE_UNKNOWN ? Barrier.OldState : pTopLevelAS->GetState();
        CHECK_STATE_TRANSITION_DESC(OldState != RESOURCE_STATE_UNKNOWN, "the state of TLAS '", TLASDesc.Name, "' is unknown to the engine and is not explicitly specified in the barrier.");
        CHECK_STATE_TRANSITION_DESC(Barrier.NewState == RESOURCE_STATE_BUILD_AS_READ || Barrier.NewState == RESOURCE_STATE_BUILD_AS_WRITE || Barrier.NewState == RESOURCE_STATE_RAY_TRACING,
                                    "invalid new state specified for TLAS '", TLASDesc.Name, "'.");
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE, "split barriers are not supported for TLAS.");
    }
    else
    {
        UNEXPECTED("unsupported resource type");
    }

    CHECK_STATE_TRANSITION_DESC((ImmediateContextMask & (Uint64{1} << Uint64{ExecutionCtxId})) != 0,
                                "resource was created with ImmediateContextMask 0x", std::hex, ImmediateContextMask, " and can not be used in device context '", CtxDesc.Name, "'.");

    if (OldState == RESOURCE_STATE_UNORDERED_ACCESS && Barrier.NewState == RESOURCE_STATE_UNORDERED_ACCESS)
    {
        CHECK_STATE_TRANSITION_DESC(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE,
                                    "for UAV barriers, transition type must be STATE_TRANSITION_TYPE_IMMEDIATE.");
    }

    switch (Barrier.TransitionType)
    {
        case STATE_TRANSITION_TYPE_IMMEDIATE:
            break;

        case STATE_TRANSITION_TYPE_BEGIN:
            CHECK_STATE_TRANSITION_DESC((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "resource state can't be updated in begin-split barrier.");
            break;

        case STATE_TRANSITION_TYPE_END:
            break;

        default:
            UNEXPECTED("Unexpected transition type");
    }

    VerifyResourceState(Barrier.OldState, CtxDesc.QueueType, "OldState");
    VerifyResourceState(Barrier.NewState, CtxDesc.QueueType, "NewState");


    return true;
}